

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)12>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Result RVar2;
  Expr *pEVar3;
  Enum EVar4;
  Var VStack_68;
  
  Var::Var(&VStack_68);
  RVar2 = ParseVar(this,&VStack_68);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    pEVar3 = (Expr *)operator_new(0x88);
    (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar3->loc).filename._M_len = loc.filename._M_len;
    (pEVar3->loc).filename._M_str = loc.filename._M_str;
    (pEVar3->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar3->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar3->type_ = Call;
    pEVar3->_vptr_Expr = (_func_int **)&PTR__VarExpr_0018af68;
    Var::Var((Var *)(pEVar3 + 1),&VStack_68);
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar3;
    EVar4 = Ok;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
      EVar4 = Ok;
    }
  }
  Var::~Var(&VStack_68);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParsePlainInstrVar(Location loc,
                                      std::unique_ptr<Expr>* out_expr) {
  Var var;
  CHECK_RESULT(ParseVar(&var));
  out_expr->reset(new T(var, loc));
  return Result::Ok;
}